

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

iteration_time __thiscall
helics::CommonCore::enterExecutingMode
          (CommonCore *this,LocalFederateId federateID,IterationRequest iterate)

{
  FederateStates FVar1;
  FederateState *this_00;
  Time TVar2;
  InvalidFunctionCall *this_01;
  undefined4 uVar3;
  char *pcVar4;
  size_t sVar5;
  pointer_____offset_0x10___ *ppuVar6;
  string_view message;
  string_view message_00;
  iteration_time iVar7;
  ActionMessage exec;
  ActionMessage AStack_d8;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid (EnterExecutingState)";
    message._M_len = 0x2a;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar6 = &InvalidIdentifier::typeinfo;
  }
  else {
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == EXECUTING) {
      TVar2.internalTimeCode = (this_00->time_granted).internalTimeCode;
      uVar3 = 0;
LAB_002ee1b8:
      iVar7._8_4_ = uVar3;
      iVar7.grantedTime.internalTimeCode = TVar2.internalTimeCode;
      iVar7._12_4_ = 0;
      return iVar7;
    }
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == INITIALIZING) {
      if (this_00->mCallbackBased != true) {
        ActionMessage::ActionMessage(&AStack_d8,cmd_exec_check);
        FederateState::addAction(this_00,&AStack_d8);
        ActionMessage::~ActionMessage(&AStack_d8);
        if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED) < 5) {
          ActionMessage::ActionMessage(&AStack_d8,cmd_stop);
          AStack_d8.dest_id.gid = (this_00->global_id)._M_i.gid;
          AStack_d8.source_id.gid = (this_00->global_id)._M_i.gid;
          FederateState::addAction(this_00,&AStack_d8);
          ActionMessage::~ActionMessage(&AStack_d8);
        }
        ActionMessage::ActionMessage(&AStack_d8,cmd_exec_request);
        AStack_d8.source_id.gid = (this_00->global_id)._M_i.gid;
        AStack_d8.dest_id.gid = (this_00->global_id)._M_i.gid;
        setIterationFlags(&AStack_d8,iterate);
        AStack_d8.flags._0_1_ = (byte)AStack_d8.flags | 0x20;
        BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_d8);
        iVar7 = FederateState::enterExecutingMode(this_00,iterate,false);
        TVar2 = iVar7.grantedTime.internalTimeCode;
        uVar3 = iVar7._8_4_;
        ActionMessage::~ActionMessage(&AStack_d8);
        goto LAB_002ee1b8;
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "enterExecutingMode is not permitted for callback based federates";
      sVar5 = 0x40;
    }
    else {
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "federate is in invalid state for calling entry to exec mode";
      sVar5 = 0x3b;
    }
    message_00._M_str = pcVar4;
    message_00._M_len = sVar5;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar6 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,HelicsException::~HelicsException);
}

Assistant:

iteration_time CommonCore::enterExecutingMode(LocalFederateId federateID, IterationRequest iterate)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (EnterExecutingState)"));
    }
    if (FederateStates::EXECUTING == fed->getState()) {
        return {fed->grantedTime(), IterationResult::NEXT_STEP};
    }
    if (FederateStates::INITIALIZING != fed->getState()) {
        throw(InvalidFunctionCall("federate is in invalid state for calling entry to exec mode"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "enterExecutingMode is not permitted for callback based federates"));
    }
    // do an exec check on the fed to process previously received messages so it can't get in a
    // deadlocked state
    fed->addAction(CMD_EXEC_CHECK);

    // do a check on the core to make sure it isn't stopped
    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }

    ActionMessage exec(CMD_EXEC_REQUEST);
    exec.source_id = fed->global_id.load();
    exec.dest_id = fed->global_id.load();
    setIterationFlags(exec, iterate);
    setActionFlag(exec, indicator_flag);
    addActionMessage(exec);

    return fed->enterExecutingMode(iterate, false);
}